

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

string * __thiscall
llama_vocab::impl::type_name_abi_cxx11_(string *__return_storage_ptr__,impl *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(this->type) {
  case LLAMA_VOCAB_TYPE_NONE:
    __s = "no vocab";
    __a = &local_9;
    break;
  case LLAMA_VOCAB_TYPE_SPM:
    __s = "SPM";
    __a = &local_a;
    break;
  case LLAMA_VOCAB_TYPE_BPE:
    __s = "BPE";
    __a = &local_b;
    break;
  case LLAMA_VOCAB_TYPE_WPM:
    __s = "WPM";
    __a = &local_c;
    break;
  case LLAMA_VOCAB_TYPE_UGM:
    __s = "UGM";
    __a = &local_d;
    break;
  case LLAMA_VOCAB_TYPE_RWKV:
    __s = "RWKV";
    __a = &local_e;
    break;
  default:
    __s = "unknown";
    __a = &local_f;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string llama_vocab::impl::type_name() const{
    switch (type) {
        case LLAMA_VOCAB_TYPE_NONE: return "no vocab";
        case LLAMA_VOCAB_TYPE_SPM:  return "SPM";
        case LLAMA_VOCAB_TYPE_BPE:  return "BPE";
        case LLAMA_VOCAB_TYPE_WPM:  return "WPM";
        case LLAMA_VOCAB_TYPE_UGM:  return "UGM";
        case LLAMA_VOCAB_TYPE_RWKV: return "RWKV";
        default:                    return "unknown";
    }
}